

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

QColor mergedColors(QColor *colorA,QColor *colorB,int factor)

{
  QColor QVar1;
  int iVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int maxFactor;
  QColor tmp;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = *in_RDI;
  uStack_10 = in_RDI[1];
  QColor::red();
  QColor::red();
  iVar2 = (int)&local_18;
  QColor::setRed(iVar2);
  QColor::green();
  QColor::green();
  QColor::setGreen(iVar2);
  QColor::blue();
  QColor::blue();
  QColor::setBlue(iVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1._8_8_ = uStack_10;
    QVar1._0_8_ = local_18;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

static QColor mergedColors(const QColor &colorA, const QColor &colorB, int factor = 50)
{
    const int maxFactor = 100;
    QColor tmp = colorA;
    tmp.setRed((tmp.red() * factor) / maxFactor + (colorB.red() * (maxFactor - factor)) / maxFactor);
    tmp.setGreen((tmp.green() * factor) / maxFactor + (colorB.green() * (maxFactor - factor)) / maxFactor);
    tmp.setBlue((tmp.blue() * factor) / maxFactor + (colorB.blue() * (maxFactor - factor)) / maxFactor);
    return tmp;
}